

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::iterate(AtomicCompSwapCase *this)

{
  RenderContext *renderContext;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  AtomicOperationCaseType AVar4;
  AtomicOperationCaseType AVar5;
  Functional *this_00;
  TestLog *pTVar6;
  bool bVar7;
  int i;
  deUint32 dVar8;
  deUint32 dVar9;
  ContextType type;
  GLSLVersion version;
  Functions *pFVar10;
  ObjectTraits *pOVar11;
  long lVar12;
  char *pcVar13;
  long *plVar14;
  size_t sVar15;
  undefined8 *puVar16;
  ImageLayerVerifier *verifyLayer;
  int i_1;
  size_type *psVar17;
  TextureFormat *pTVar18;
  long *plVar19;
  ulong *puVar20;
  undefined **ppuVar21;
  RenderContext *renderContext_00;
  char *pcVar22;
  int x;
  int x_00;
  ulong uVar23;
  RenderContext RVar24;
  undefined8 uVar25;
  undefined1 isSampler;
  TextureType TVar26;
  int iVar27;
  int z;
  GLuint z_00;
  ChannelType CVar28;
  int y;
  int iVar29;
  bool bVar30;
  bool bVar31;
  uint local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  GLenum local_c4c;
  string curPixelInvocationNdx;
  GLuint local_c24;
  int local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  int local_bf8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  string wrapX_1;
  ulong *local_ba8;
  long local_ba0;
  ulong local_b98;
  long lStack_b90;
  ChannelType local_b84;
  CallLogWrapper glLog;
  long *local_b68;
  long local_b60;
  long local_b58;
  long lStack_b50;
  long *local_b48;
  long local_b40;
  long local_b38;
  long lStack_b30;
  long *local_b28;
  long local_b20;
  long local_b18;
  long lStack_b10;
  long *local_b08;
  long local_b00;
  long local_af8;
  long lStack_af0;
  long *local_ae8;
  long local_ae0;
  long local_ad8;
  long lStack_ad0;
  long *local_ac8;
  long local_ac0;
  long local_ab8;
  long lStack_ab0;
  long *local_aa8;
  long local_aa0;
  long local_a98;
  long lStack_a90;
  string atomicCoord;
  string colorScalarTypeName;
  RenderContext *local_a38;
  long local_a30;
  RenderContext local_a28;
  undefined8 uStack_a20;
  long *local_a18;
  long local_a10;
  long local_a08;
  long lStack_a00;
  int local_9f4;
  ulong *local_9f0;
  long local_9e8;
  ulong local_9e0;
  long lStack_9d8;
  ulong *local_9d0;
  long local_9c8;
  ulong local_9c0;
  long lStack_9b8;
  ulong *local_9b0;
  long local_9a8;
  ulong local_9a0 [2];
  ulong *local_990;
  long local_988;
  ulong local_980;
  long lStack_978;
  ulong *local_970;
  long local_968;
  ulong local_960;
  long lStack_958;
  ulong *local_950;
  long local_948;
  ulong local_940;
  long lStack_938;
  ulong *local_930;
  long local_928;
  ulong local_920;
  long lStack_918;
  ulong *local_910;
  long local_908;
  ulong local_900;
  long lStack_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  long *local_8d0;
  undefined8 local_8c8;
  long local_8c0;
  undefined8 uStack_8b8;
  long *local_8b0;
  undefined8 local_8a8;
  long local_8a0;
  undefined8 uStack_898;
  long *local_890;
  undefined8 local_888;
  long local_880;
  undefined8 uStack_878;
  long *local_870;
  undefined8 local_868;
  long local_860;
  undefined8 uStack_858;
  long *local_850;
  undefined8 local_848;
  long local_840;
  undefined8 uStack_838;
  TestLog *local_830;
  long *local_828 [2];
  long local_818 [2];
  long *local_808 [2];
  long local_7f8 [2];
  long *local_7e8 [2];
  long local_7d8 [2];
  long *local_7c8 [2];
  long local_7b8 [2];
  string colorVecTypeName;
  string shaderImageTypeStr;
  Vector<int,_3> res;
  int iStack_75c;
  ulong local_758;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  _Stack_750;
  ios_base local_6f8 [8];
  ios_base local_6f0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  string local_588;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  Texture returnValueTexture;
  Texture endResultTexture;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  string invocationCoord;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  string shaderImageFormatStr;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  string glslVersionDeclaration;
  LayeredImage imageData;
  GLuint local_180;
  bool local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  uint local_128;
  value_type local_120;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  _Vector_impl_data local_50;
  
  this_00 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))(this_00);
  glu::CallLogWrapper::CallLogWrapper(&glLog,pFVar10,pTVar6);
  dVar8 = glu::getInternalFormat(this->m_format);
  switch(this->m_imageType) {
  case TEXTURETYPE_2D:
    local_bf8[0] = 0x40;
    local_bf8[1] = 0x40;
    local_c4c = 0xde1;
    local_c20 = 0x40;
    goto LAB_0147b7ae;
  case TEXTURETYPE_CUBE:
    local_bf8[0] = 0x40;
    local_bf8[1] = 0x40;
    local_bf8[2] = 1;
    local_c24 = 6;
    bVar7 = true;
    local_c4c = 0x8513;
    local_c20 = 0x40;
    iVar29 = 1;
    local_c80 = 0x40;
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_c4c = 0x8c1a;
    goto LAB_0147b74d;
  case TEXTURETYPE_3D:
    local_c4c = 0x806f;
LAB_0147b74d:
    local_bf8[2] = 8;
    local_bf8[0] = 0x40;
    local_bf8[1] = 0x40;
    bVar7 = true;
    local_c20 = 0x40;
    iVar29 = 8;
    local_c80 = 0x40;
    local_c24 = 8;
    break;
  default:
    local_bf8[2] = 0xffffffff;
    local_bf8[0] = -1;
    local_bf8[1] = -1;
    iVar29 = -1;
    bVar7 = false;
    local_c20 = -1;
    local_c80 = 0xffffffff;
    local_c4c = 0xffffffff;
    local_c24 = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    local_bf8[0] = 0x40;
    local_bf8[1] = 1;
    local_c4c = 0x8c2a;
    local_c20 = 1;
LAB_0147b7ae:
    local_bf8[2] = 1;
    bVar7 = true;
    local_c80 = 0x40;
    iVar29 = 1;
    local_c24 = 1;
  }
  local_b84 = (this->m_format).type;
  bVar30 = (local_b84 & ~SNORM_INT16) != UNSIGNED_INT8;
  bVar31 = local_b84 != UNSIGNED_INT32;
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))(this_00);
  pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper,pFVar10,pOVar11);
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))(this_00);
  pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper,pFVar10,pOVar11);
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&endResultTexture.super_ObjectWrapper,pFVar10,pOVar11);
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&returnValueTexture.super_ObjectWrapper,pFVar10,pOVar11);
  glLog.m_enableLog = true;
  poVar2 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,") to act as the target of atomic operations",0x2b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_6f0);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_6f0);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Created a texture (name ",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               ") to which the intermediate return values of the atomic operation are stored",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_6f0);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      poVar2 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"// Created a buffer for the texture (name ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_6f0);
    }
  }
  local_830 = pTVar6;
  LayeredImage::LayeredImage
            (&imageData,this->m_imageType,&this->m_format,local_c80,local_c20,iVar29);
  if (bVar7) {
    z_00 = 0;
    do {
      if (bVar7) {
        local_9f4 = z_00 * z_00;
        iVar29 = 0;
        do {
          if (bVar7) {
            iVar27 = iVar29 * iVar29 + local_9f4;
            uVar23 = 0;
            do {
              x_00 = (int)uVar23;
              res.m_data[1] = (int)(uVar23 / local_c80) * 0x2a + x_00 * x_00 + iVar27;
              res.m_data[0] = res.m_data[1];
              stack0xfffffffffffff8a0 = (TestLog *)CONCAT44(res.m_data[1],res.m_data[1]);
              Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                        ((LayeredImage *)&imageData,x_00,iVar29,z_00,(Vector<int,_4> *)&res);
              uVar23 = (ulong)(x_00 + 1U);
            } while (local_c80 != x_00 + 1U);
          }
          iVar29 = iVar29 + 1;
        } while (iVar29 != local_c20);
      }
      z_00 = z_00 + 1;
    } while (z_00 != local_c24);
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  pTVar6 = local_830;
  glu::CallLogWrapper::glBindTexture(&glLog,local_c4c,endResultTexture.super_ObjectWrapper.m_object)
  ;
  setTexParameteri(&glLog,local_c4c);
  poVar2 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Filling end-result texture with initial pattern",0x32);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_6f0);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar8);
  CVar28 = local_b84;
  lVar12 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x951);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,local_c4c,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,local_c4c);
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Setting storage of return-value texture",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_6f0);
    TVar26 = this->m_imageType;
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[0] = (uint)(TVar26 == TEXTURETYPE_CUBE) * 4 + 1;
    imageData.m_size.m_data[1] = 1;
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    stack0xfffffffffffff8a0 = (TestLog *)((ulong)stack0xfffffffffffff8a0 & 0xffffffff00000000);
    lVar12 = 0;
    do {
      res.m_data[lVar12] = imageData.m_size.m_data[lVar12 + -1] * local_bf8[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    setTextureStorage(&glLog,TVar26,dVar8,&res,returnValueTextureBuf.super_ObjectWrapper.m_object);
    CVar28 = local_b84;
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar8);
    lVar12 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar8 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar8,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x961);
  }
  pcVar13 = (char *)0x0;
  if (CVar28 - SIGNED_INT8 < 3) {
    pcVar13 = "int";
  }
  pcVar22 = "uint";
  if (bVar31 && bVar30) {
    pcVar22 = pcVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorScalarTypeName,pcVar22,(allocator<char> *)&res);
  pcVar13 = (char *)0x0;
  if (CVar28 - SIGNED_INT8 < 3) {
    pcVar13 = "i";
  }
  pcVar22 = "u";
  if (bVar31 && bVar30) {
    pcVar22 = pcVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,pcVar22,(allocator<char> *)&imageData);
  plVar14 = (long *)std::__cxx11::string::append((char *)&res);
  colorVecTypeName._M_dataplus._M_p = (pointer)&colorVecTypeName.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar17) {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar17;
    colorVecTypeName.field_2._8_8_ = plVar14[3];
  }
  else {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar17;
    colorVecTypeName._M_dataplus._M_p = (pointer)*plVar14;
  }
  colorVecTypeName._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_758) {
    operator_delete((void *)res.m_data._0_8_,local_758 + 1);
  }
  if (this->m_imageType == TEXTURETYPE_2D) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
    std::ostream::operator<<(&res,local_c80);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
    std::ios_base::~ios_base(local_6f8);
    isSampler = 0xb;
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x1c59659);
    imageData._0_8_ = &imageData.m_format;
    pTVar18 = (TextureFormat *)(plVar14 + 2);
    if ((TextureFormat *)*plVar14 == pTVar18) {
      imageData.m_format = *pTVar18;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar14[3];
    }
    else {
      imageData.m_format = *pTVar18;
      imageData._0_8_ = (TextureFormat *)*plVar14;
    }
    imageData.m_size.m_data[1] = (int)plVar14[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar14[1] >> 0x20);
    *plVar14 = (long)pTVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&imageData);
LAB_0147c1fc:
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      atomicCoord.field_2._M_allocated_capacity = *psVar17;
      atomicCoord.field_2._8_8_ = plVar14[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar17;
      atomicCoord._M_dataplus._M_p = (pointer)*plVar14;
    }
    atomicCoord._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
LAB_0147c285:
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
  }
  else {
    if (this->m_imageType != TEXTURETYPE_BUFFER) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
      std::ostream::operator<<(&res,local_c80);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
      std::ios_base::~ios_base(local_6f8);
      isSampler = 0xb;
      plVar14 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x1c59665);
      imageData._0_8_ = &imageData.m_format;
      pTVar18 = (TextureFormat *)(plVar14 + 2);
      if ((TextureFormat *)*plVar14 == pTVar18) {
        imageData.m_format = *pTVar18;
        imageData.m_texBuffer.m_ptr = (Texture1D *)plVar14[3];
      }
      else {
        imageData.m_format = *pTVar18;
        imageData._0_8_ = (TextureFormat *)*plVar14;
      }
      imageData.m_size.m_data[1] = (int)plVar14[1];
      imageData.m_size.m_data[2] = (int)((ulong)plVar14[1] >> 0x20);
      *plVar14 = (long)pTVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&imageData);
      goto LAB_0147c1fc;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
    std::ostream::operator<<(&res,local_c80);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
    std::ios_base::~ios_base(local_6f8);
    isSampler = 5;
    plVar14 = (long *)std::__cxx11::string::replace((ulong)&imageData,0,(char *)0x0,0x1c5965f);
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      atomicCoord.field_2._M_allocated_capacity = *psVar17;
      atomicCoord.field_2._8_8_ = plVar14[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar17;
      atomicCoord._M_dataplus._M_p = (pointer)*plVar14;
    }
    atomicCoord._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_100._0_8_ = CONCAT44(imageData.m_size.m_data[0],imageData.m_type);
    local_100._16_8_ = imageData.m_format;
    if ((TextureFormat *)local_100._0_8_ != &imageData.m_format) goto LAB_0147c285;
  }
  pcVar13 = "ivec3(gx, gy, gz)";
  if (this->m_imageType == TEXTURETYPE_2D) {
    pcVar13 = "ivec2(gx, gy)";
  }
  pcVar22 = "gx";
  if (this->m_imageType != TEXTURETYPE_BUFFER) {
    pcVar22 = pcVar13;
  }
  invocationCoord._M_dataplus._M_p = (pointer)&invocationCoord.field_2;
  sVar15 = strlen(pcVar22);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&invocationCoord,pcVar22,pcVar22 + sVar15);
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)(ulong)(this->m_format).order,
             (TextureFormat *)(ulong)(this->m_format).type);
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,this->m_imageType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_00 + 0x10))(this_00);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar13 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar13,(allocator<char> *)&res);
  memset(local_100,0,0xac);
  local_50._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_50._M_finish._1_7_ = 0;
  stack0xffffffffffffffc0 = SUB169((undefined1  [16])0x0,7);
  local_9b0 = local_9a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9b0,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_9b0);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_588,this_00,renderContext_00);
  uVar23 = 0xf;
  if (local_9b0 != local_9a0) {
    uVar23 = local_9a0[0];
  }
  if (uVar23 < local_588._M_string_length + local_9a8) {
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      uVar25 = local_588.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < local_588._M_string_length + local_9a8) goto LAB_0147c412;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,(ulong)local_9b0);
  }
  else {
LAB_0147c412:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_9b0,(ulong)local_588._M_dataplus._M_p);
  }
  local_a38 = &local_a28;
  renderContext = (RenderContext *)(puVar16 + 2);
  if ((RenderContext *)*puVar16 == renderContext) {
    local_a28._vptr_RenderContext = renderContext->_vptr_RenderContext;
    uStack_a20 = puVar16[3];
  }
  else {
    local_a28._vptr_RenderContext = renderContext->_vptr_RenderContext;
    local_a38 = (RenderContext *)*puVar16;
  }
  local_a30 = puVar16[1];
  *puVar16 = renderContext;
  puVar16[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_5a8,(Functional *)(ulong)this->m_imageType,(TextureType)this_00,renderContext);
  RVar24._vptr_RenderContext = (_func_int **)0xf;
  if (local_a38 != &local_a28) {
    RVar24._vptr_RenderContext = local_a28._vptr_RenderContext;
  }
  if (RVar24._vptr_RenderContext < (_func_int **)(local_5a8._M_string_length + local_a30)) {
    uVar25 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      uVar25 = local_5a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < (_func_int **)(local_5a8._M_string_length + local_a30)) goto LAB_0147c4f8;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5a8,0,(char *)0x0,(ulong)local_a38);
  }
  else {
LAB_0147c4f8:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_a38,(ulong)local_5a8._M_dataplus._M_p);
  }
  local_8d0 = &local_8c0;
  plVar14 = puVar16 + 2;
  if ((long *)*puVar16 == plVar14) {
    local_8c0 = *plVar14;
    uStack_8b8 = puVar16[3];
  }
  else {
    local_8c0 = *plVar14;
    local_8d0 = (long *)*puVar16;
  }
  local_8c8 = puVar16[1];
  *puVar16 = plVar14;
  puVar16[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_8d0);
  local_568 = &local_558;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_558 = *plVar19;
    lStack_550 = plVar14[3];
  }
  else {
    local_558 = *plVar19;
    local_568 = (long *)*plVar14;
  }
  local_560 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_568,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_548 = &local_538;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_538 = *plVar19;
    lStack_530 = plVar14[3];
  }
  else {
    local_538 = *plVar19;
    local_548 = (long *)*plVar14;
  }
  local_540 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_548);
  local_528 = &local_518;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_518 = *plVar19;
    lStack_510 = plVar14[3];
  }
  else {
    local_518 = *plVar19;
    local_528 = (long *)*plVar14;
  }
  local_520 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_528,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_508 = &local_4f8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_4f8 = *plVar19;
    lStack_4f0 = plVar14[3];
  }
  else {
    local_4f8 = *plVar19;
    local_508 = (long *)*plVar14;
  }
  local_500 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_508);
  local_4e8 = &local_4d8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_4d8 = *plVar19;
    lStack_4d0 = plVar14[3];
  }
  else {
    local_4d8 = *plVar19;
    local_4e8 = (long *)*plVar14;
  }
  local_4e0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4e8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_4c8 = &local_4b8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_4b8 = *plVar19;
    lStack_4b0 = plVar14[3];
  }
  else {
    local_4b8 = *plVar19;
    local_4c8 = (long *)*plVar14;
  }
  local_4c0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_920 = *puVar20;
    lStack_918 = plVar14[3];
    local_930 = &local_920;
  }
  else {
    local_920 = *puVar20;
    local_930 = (ulong *)*plVar14;
  }
  local_928 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  AVar4 = this->m_caseType;
  if (AVar4 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_148,"layout (",&shaderImageFormatStr);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_2e8 = &local_2d8;
    plVar19 = plVar14 + 2;
    if ((long *)*plVar14 == plVar19) {
      local_2d8 = *plVar19;
      lStack_2d0 = plVar14[3];
    }
    else {
      local_2d8 = *plVar19;
      local_2e8 = (long *)*plVar14;
    }
    local_2e0 = plVar14[1];
    *plVar14 = (long)plVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2e8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
    local_2c8 = &local_2b8;
    plVar19 = plVar14 + 2;
    if ((long *)*plVar14 == plVar19) {
      local_2b8 = *plVar19;
      lStack_2b0 = plVar14[3];
    }
    else {
      local_2b8 = *plVar19;
      local_2c8 = (long *)*plVar14;
    }
    local_2c0 = plVar14[1];
    *plVar14 = (long)plVar19;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_9d0 = &local_9c0;
    puVar20 = (ulong *)(plVar14 + 2);
    if ((ulong *)*plVar14 == puVar20) {
      local_9c0 = *puVar20;
      lStack_9b8 = plVar14[3];
    }
    else {
      local_9c0 = *puVar20;
      local_9d0 = (ulong *)*plVar14;
    }
    local_9c8 = plVar14[1];
    *plVar14 = (long)puVar20;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
  }
  else {
    local_9d0 = &local_9c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,0x1af8059);
  }
  uVar23 = 0xf;
  if (local_930 != &local_920) {
    uVar23 = local_920;
  }
  if (uVar23 < (ulong)(local_9c8 + local_928)) {
    uVar23 = 0xf;
    if (local_9d0 != &local_9c0) {
      uVar23 = local_9c0;
    }
    if (uVar23 < (ulong)(local_9c8 + local_928)) goto LAB_0147ca25;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9d0,0,(char *)0x0,(ulong)local_930);
  }
  else {
LAB_0147ca25:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_930,(ulong)local_9d0);
  }
  local_8b0 = &local_8a0;
  plVar14 = puVar16 + 2;
  if ((long *)*puVar16 == plVar14) {
    local_8a0 = *plVar14;
    uStack_898 = puVar16[3];
  }
  else {
    local_8a0 = *plVar14;
    local_8b0 = (long *)*puVar16;
  }
  local_8a8 = puVar16[1];
  *puVar16 = plVar14;
  puVar16[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_8b0);
  local_4a8 = &local_498;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_498 = *plVar19;
    lStack_490 = plVar14[3];
  }
  else {
    local_498 = *plVar19;
    local_4a8 = (long *)*plVar14;
  }
  local_4a0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4a8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_488 = &local_478;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_478 = *plVar19;
    lStack_470 = plVar14[3];
  }
  else {
    local_478 = *plVar19;
    local_488 = (long *)*plVar14;
  }
  local_480 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_488);
  local_468 = &local_458;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_458 = *plVar19;
    lStack_450 = plVar14[3];
  }
  else {
    local_458 = *plVar19;
    local_468 = (long *)*plVar14;
  }
  local_460 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_468,(ulong)colorScalarTypeName._M_dataplus._M_p);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_900 = *puVar20;
    lStack_8f8 = plVar14[3];
    local_910 = &local_900;
  }
  else {
    local_900 = *puVar20;
    local_910 = (ulong *)*plVar14;
  }
  local_908 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"gx","");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"gy","");
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"gz","");
  iVar29 = local_bf8[0];
  std::operator+(&local_c18,"(",&local_5c8);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c18);
  paVar1 = &local_c70.field_2;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_c70.field_2._M_allocated_capacity = *puVar20;
    local_c70.field_2._8_8_ = plVar14[3];
    local_c70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c70.field_2._M_allocated_capacity = *puVar20;
    local_c70._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c70._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar29);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_6f8);
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != paVar1) {
    uVar25 = local_c70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < local_be8._M_string_length + local_c70._M_string_length) {
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
      uVar25 = local_be8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < local_be8._M_string_length + local_c70._M_string_length) goto LAB_0147cdd2;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_be8,0,(char *)0x0,(ulong)local_c70._M_dataplus._M_p);
  }
  else {
LAB_0147cdd2:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_c70,(ulong)local_be8._M_dataplus._M_p);
  }
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar17 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar17) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx.field_2._8_8_ = puVar16[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*puVar16;
  }
  curPixelInvocationNdx._M_string_length = puVar16[1];
  *puVar16 = psVar17;
  puVar16[1] = 0;
  *(char *)psVar17 = '\0';
  plVar14 = (long *)std::__cxx11::string::append((char *)&curPixelInvocationNdx);
  wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar17) {
    wrapX_1.field_2._M_allocated_capacity = *psVar17;
    wrapX_1.field_2._8_8_ = plVar14[3];
  }
  else {
    wrapX_1.field_2._M_allocated_capacity = *psVar17;
    wrapX_1._M_dataplus._M_p = (pointer)*plVar14;
  }
  wrapX_1._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_be8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != paVar1) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_c18.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_be8,"(",&local_5c8);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_be8);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_c18.field_2._M_allocated_capacity = *puVar20;
    local_c18.field_2._8_8_ = plVar14[3];
    local_c18._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c18.field_2._M_allocated_capacity = *puVar20;
    local_c18._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c18._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar29);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_6f8);
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    uVar25 = local_c18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < local_ba0 + local_c18._M_string_length) {
    uVar23 = 0xf;
    if (local_ba8 != &local_b98) {
      uVar23 = local_b98;
    }
    if (uVar23 < local_ba0 + local_c18._M_string_length) goto LAB_0147d030;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_ba8,0,(char *)0x0,(ulong)local_c18._M_dataplus._M_p);
  }
  else {
LAB_0147d030:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_ba8);
  }
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  psVar17 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70.field_2._8_8_ = puVar16[3];
  }
  else {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_c70._M_string_length = puVar16[1];
  *puVar16 = psVar17;
  puVar16[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c70);
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar17) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx.field_2._8_8_ = plVar14[3];
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar14;
  }
  curPixelInvocationNdx._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8,local_b98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_8f0,"(",&wrapX_1);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_8f0);
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_a08 = *plVar19;
    lStack_a00 = plVar14[3];
    local_a18 = &local_a08;
  }
  else {
    local_a08 = *plVar19;
    local_a18 = (long *)*plVar14;
  }
  local_a10 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_a18,(ulong)wrapX_1._M_dataplus._M_p);
  local_b68 = &local_b58;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b58 = *plVar19;
    lStack_b50 = plVar14[3];
  }
  else {
    local_b58 = *plVar19;
    local_b68 = (long *)*plVar14;
  }
  local_b60 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_b68);
  local_b48 = &local_b38;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b38 = *plVar19;
    lStack_b30 = plVar14[3];
  }
  else {
    local_b38 = *plVar19;
    local_b48 = (long *)*plVar14;
  }
  local_b40 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_b48,(ulong)local_7c8[0]);
  local_b28 = &local_b18;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b18 = *plVar19;
    lStack_b10 = plVar14[3];
  }
  else {
    local_b18 = *plVar19;
    local_b28 = (long *)*plVar14;
  }
  local_b20 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_b28);
  local_b08 = &local_af8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_af8 = *plVar19;
    lStack_af0 = plVar14[3];
  }
  else {
    local_af8 = *plVar19;
    local_b08 = (long *)*plVar14;
  }
  local_b00 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_b08,(ulong)local_7c8[0]);
  local_ae8 = &local_ad8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_ad8 = *plVar19;
    lStack_ad0 = plVar14[3];
  }
  else {
    local_ad8 = *plVar19;
    local_ae8 = (long *)*plVar14;
  }
  local_ae0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_ae8);
  local_ac8 = &local_ab8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_ab8 = *plVar19;
    lStack_ab0 = plVar14[3];
  }
  else {
    local_ab8 = *plVar19;
    local_ac8 = (long *)*plVar14;
  }
  local_ac0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_ac8,(ulong)local_7e8[0]);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_b98 = *puVar20;
    lStack_b90 = plVar14[3];
    local_ba8 = &local_b98;
  }
  else {
    local_b98 = *puVar20;
    local_ba8 = (ulong *)*plVar14;
  }
  local_ba0 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_be8.field_2._M_allocated_capacity = *puVar20;
    local_be8.field_2._8_8_ = plVar14[3];
    local_be8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_be8.field_2._M_allocated_capacity = *puVar20;
    local_be8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_be8._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_be8,(ulong)local_7e8[0]);
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c18.field_2._M_allocated_capacity = *psVar17;
    local_c18.field_2._8_8_ = plVar14[3];
    local_c18._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c18.field_2._M_allocated_capacity = *psVar17;
    local_c18._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c18._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70.field_2._8_8_ = plVar14[3];
  }
  else {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c70._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_c70,(ulong)curPixelInvocationNdx._M_dataplus._M_p);
  res.m_data._0_8_ = &local_758;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_758 = *puVar20;
    _Stack_750._M_impl._0_8_ = plVar14[3];
  }
  else {
    local_758 = *puVar20;
    res.m_data._0_8_ = (ulong *)*plVar14;
  }
  unique0x00012000 = (TestLog *)plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&res);
  local_9f0 = &local_9e0;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_9e0 = *puVar20;
    lStack_9d8 = plVar14[3];
  }
  else {
    local_9e0 = *puVar20;
    local_9f0 = (ulong *)*plVar14;
  }
  local_9e8 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_758) {
    operator_delete((void *)res.m_data._0_8_,local_758 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8,local_b98 + 1);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8,local_ab8 + 1);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8,local_ad8 + 1);
  }
  if (local_b08 != &local_af8) {
    operator_delete(local_b08,local_af8 + 1);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28,local_b18 + 1);
  }
  if (local_b48 != &local_b38) {
    operator_delete(local_b48,local_b38 + 1);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68,local_b58 + 1);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18,local_a08 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
    operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
  }
  uVar23 = 0xf;
  if (local_910 != &local_900) {
    uVar23 = local_900;
  }
  if (uVar23 < (ulong)(local_9e8 + local_908)) {
    uVar23 = 0xf;
    if (local_9f0 != &local_9e0) {
      uVar23 = local_9e0;
    }
    if (uVar23 < (ulong)(local_9e8 + local_908)) goto LAB_0147d8f5;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9f0,0,(char *)0x0,(ulong)local_910);
  }
  else {
LAB_0147d8f5:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_910,(ulong)local_9f0);
  }
  local_890 = &local_880;
  plVar14 = puVar16 + 2;
  if ((long *)*puVar16 == plVar14) {
    local_880 = *plVar14;
    uStack_878 = puVar16[3];
  }
  else {
    local_880 = *plVar14;
    local_890 = (long *)*puVar16;
  }
  local_888 = puVar16[1];
  *puVar16 = plVar14;
  puVar16[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_890);
  local_448 = &local_438;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_438 = *plVar19;
    lStack_430 = plVar14[3];
  }
  else {
    local_438 = *plVar19;
    local_448 = (long *)*plVar14;
  }
  local_440 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_448,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_428 = &local_418;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_418 = *plVar19;
    lStack_410 = plVar14[3];
  }
  else {
    local_418 = *plVar19;
    local_428 = (long *)*plVar14;
  }
  local_420 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_428);
  local_408 = &local_3f8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_3f8 = *plVar19;
    lStack_3f0 = plVar14[3];
  }
  else {
    local_3f8 = *plVar19;
    local_408 = (long *)*plVar14;
  }
  local_400 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_408,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_990 = &local_980;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_980 = *puVar20;
    lStack_978 = plVar14[3];
  }
  else {
    local_980 = *puVar20;
    local_990 = (ulong *)*plVar14;
  }
  local_988 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"gx","");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"gy","");
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"gz","");
  std::operator+(&local_c18,"(",&local_5e8);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_c70.field_2._M_allocated_capacity = *puVar20;
    local_c70.field_2._8_8_ = plVar14[3];
  }
  else {
    local_c70.field_2._M_allocated_capacity = *puVar20;
    local_c70._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c70._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar29);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_6f8);
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    uVar25 = local_c70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < local_be8._M_string_length + local_c70._M_string_length) {
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be8._M_dataplus._M_p != paVar3) {
      uVar25 = local_be8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < local_be8._M_string_length + local_c70._M_string_length) goto LAB_0147dc94;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_be8,0,(char *)0x0,(ulong)local_c70._M_dataplus._M_p);
  }
  else {
LAB_0147dc94:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_c70,(ulong)local_be8._M_dataplus._M_p);
  }
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar17 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar17) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx.field_2._8_8_ = puVar16[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*puVar16;
  }
  curPixelInvocationNdx._M_string_length = puVar16[1];
  *puVar16 = psVar17;
  puVar16[1] = 0;
  *(char *)psVar17 = '\0';
  plVar14 = (long *)std::__cxx11::string::append((char *)&curPixelInvocationNdx);
  wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar17) {
    wrapX_1.field_2._M_allocated_capacity = *psVar17;
    wrapX_1.field_2._8_8_ = plVar14[3];
  }
  else {
    wrapX_1.field_2._M_allocated_capacity = *psVar17;
    wrapX_1._M_dataplus._M_p = (pointer)*plVar14;
  }
  wrapX_1._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_be8,"(",&local_5e8);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_be8);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_c18.field_2._M_allocated_capacity = *puVar20;
    local_c18.field_2._8_8_ = plVar14[3];
    local_c18._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c18.field_2._M_allocated_capacity = *puVar20;
    local_c18._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c18._M_string_length = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,iVar29);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_6f8);
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    uVar25 = local_c18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < local_ba0 + local_c18._M_string_length) {
    uVar23 = 0xf;
    if (local_ba8 != &local_b98) {
      uVar23 = local_b98;
    }
    if (uVar23 < local_ba0 + local_c18._M_string_length) goto LAB_0147dee9;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_ba8,0,(char *)0x0,(ulong)local_c18._M_dataplus._M_p);
  }
  else {
LAB_0147dee9:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_ba8);
  }
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  psVar17 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70.field_2._8_8_ = puVar16[3];
  }
  else {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_c70._M_string_length = puVar16[1];
  *puVar16 = psVar17;
  puVar16[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c70);
  curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar17) {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx.field_2._8_8_ = plVar14[3];
  }
  else {
    curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
    curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar14;
  }
  curPixelInvocationNdx._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8,local_b98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_8f0,"(",&wrapX_1);
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_8f0);
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_a08 = *plVar19;
    lStack_a00 = plVar14[3];
    local_a18 = &local_a08;
  }
  else {
    local_a08 = *plVar19;
    local_a18 = (long *)*plVar14;
  }
  local_a10 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_a18,(ulong)wrapX_1._M_dataplus._M_p);
  local_b68 = &local_b58;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b58 = *plVar19;
    lStack_b50 = plVar14[3];
  }
  else {
    local_b58 = *plVar19;
    local_b68 = (long *)*plVar14;
  }
  local_b60 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_b68);
  local_b48 = &local_b38;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b38 = *plVar19;
    lStack_b30 = plVar14[3];
  }
  else {
    local_b38 = *plVar19;
    local_b48 = (long *)*plVar14;
  }
  local_b40 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_b48,(ulong)local_808[0]);
  local_b28 = &local_b18;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_b18 = *plVar19;
    lStack_b10 = plVar14[3];
  }
  else {
    local_b18 = *plVar19;
    local_b28 = (long *)*plVar14;
  }
  local_b20 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_b28);
  local_b08 = &local_af8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_af8 = *plVar19;
    lStack_af0 = plVar14[3];
  }
  else {
    local_af8 = *plVar19;
    local_b08 = (long *)*plVar14;
  }
  local_b00 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_b08,(ulong)local_808[0]);
  local_ae8 = &local_ad8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_ad8 = *plVar19;
    lStack_ad0 = plVar14[3];
  }
  else {
    local_ad8 = *plVar19;
    local_ae8 = (long *)*plVar14;
  }
  local_ae0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_ae8);
  local_ac8 = &local_ab8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_ab8 = *plVar19;
    lStack_ab0 = plVar14[3];
  }
  else {
    local_ab8 = *plVar19;
    local_ac8 = (long *)*plVar14;
  }
  local_ac0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_ac8,(ulong)local_828[0]);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_b98 = *puVar20;
    lStack_b90 = plVar14[3];
    local_ba8 = &local_b98;
  }
  else {
    local_b98 = *puVar20;
    local_ba8 = (ulong *)*plVar14;
  }
  local_ba0 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_be8.field_2._M_allocated_capacity = *psVar17;
    local_be8.field_2._8_8_ = plVar14[3];
    local_be8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_be8.field_2._M_allocated_capacity = *psVar17;
    local_be8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_be8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_be8,(ulong)local_828[0]);
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c18.field_2._M_allocated_capacity = *psVar17;
    local_c18.field_2._8_8_ = plVar14[3];
    local_c18._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c18.field_2._M_allocated_capacity = *psVar17;
    local_c18._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c18._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70.field_2._8_8_ = plVar14[3];
  }
  else {
    local_c70.field_2._M_allocated_capacity = *psVar17;
    local_c70._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_c70._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_c70,(ulong)curPixelInvocationNdx._M_dataplus._M_p);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_758 = *puVar20;
    _Stack_750._M_impl._0_8_ = plVar14[3];
    res.m_data._0_8_ = &local_758;
  }
  else {
    local_758 = *puVar20;
    res.m_data._0_8_ = (ulong *)*plVar14;
  }
  unique0x00012000 = (TestLog *)plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&res);
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_940 = *puVar20;
    lStack_938 = plVar14[3];
    local_950 = &local_940;
  }
  else {
    local_940 = *puVar20;
    local_950 = (ulong *)*plVar14;
  }
  local_948 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((ulong *)res.m_data._0_8_ != &local_758) {
    operator_delete((void *)res.m_data._0_8_,local_758 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != paVar1) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != paVar3) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if (local_ba8 != &local_b98) {
    operator_delete(local_ba8,local_b98 + 1);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8,local_ab8 + 1);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8,local_ad8 + 1);
  }
  if (local_b08 != &local_af8) {
    operator_delete(local_b08,local_af8 + 1);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28,local_b18 + 1);
  }
  if (local_b48 != &local_b38) {
    operator_delete(local_b48,local_b38 + 1);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68,local_b58 + 1);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18,local_a08 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
    operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                    curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
    operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
  }
  uVar23 = 0xf;
  if (local_990 != &local_980) {
    uVar23 = local_980;
  }
  if (uVar23 < (ulong)(local_948 + local_988)) {
    uVar23 = 0xf;
    if (local_950 != &local_940) {
      uVar23 = local_940;
    }
    if (uVar23 < (ulong)(local_948 + local_988)) goto LAB_0147e7af;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_950,0,(char *)0x0,(ulong)local_990);
  }
  else {
LAB_0147e7af:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_990,(ulong)local_950);
  }
  local_870 = &local_860;
  plVar14 = puVar16 + 2;
  if ((long *)*puVar16 == plVar14) {
    local_860 = *plVar14;
    uStack_858 = puVar16[3];
  }
  else {
    local_860 = *plVar14;
    local_870 = (long *)*puVar16;
  }
  local_868 = puVar16[1];
  *puVar16 = plVar14;
  puVar16[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_870);
  local_3e8 = &local_3d8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_3d8 = *plVar19;
    lStack_3d0 = plVar14[3];
  }
  else {
    local_3d8 = *plVar19;
    local_3e8 = (long *)*plVar14;
  }
  local_3e0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3e8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_3c8 = &local_3b8;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_3b8 = *plVar19;
    lStack_3b0 = plVar14[3];
  }
  else {
    local_3b8 = *plVar19;
    local_3c8 = (long *)*plVar14;
  }
  local_3c0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  local_aa8 = &local_a98;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_a98 = *plVar19;
    lStack_a90 = plVar14[3];
  }
  else {
    local_a98 = *plVar19;
    local_aa8 = (long *)*plVar14;
  }
  local_aa0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_aa8,(ulong)colorScalarTypeName._M_dataplus._M_p);
  local_3a8 = &local_398;
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_398 = *plVar19;
    lStack_390 = plVar14[3];
  }
  else {
    local_398 = *plVar19;
    local_3a8 = (long *)*plVar14;
  }
  local_3a0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_328 = *plVar19;
    lStack_320 = plVar14[3];
    local_338 = &local_328;
  }
  else {
    local_328 = *plVar19;
    local_338 = (long *)*plVar14;
  }
  local_330 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_338,(ulong)atomicCoord._M_dataplus._M_p);
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_298 = *plVar19;
    lStack_290 = plVar14[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar19;
    local_2a8 = (long *)*plVar14;
  }
  local_2a0 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  local_970 = &local_960;
  puVar20 = (ulong *)(plVar14 + 2);
  if ((ulong *)*plVar14 == puVar20) {
    local_960 = *puVar20;
    lStack_958 = plVar14[3];
  }
  else {
    local_960 = *puVar20;
    local_970 = (ulong *)*plVar14;
  }
  local_968 = plVar14[1];
  *plVar14 = (long)puVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  AVar5 = this->m_caseType;
  if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_c70,"\timageStore(u_returnValues, ",&invocationCoord);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_c70);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
      curPixelInvocationNdx.field_2._8_8_ = plVar14[3];
      curPixelInvocationNdx._M_dataplus._M_p = (pointer)&curPixelInvocationNdx.field_2;
    }
    else {
      curPixelInvocationNdx.field_2._M_allocated_capacity = *psVar17;
      curPixelInvocationNdx._M_dataplus._M_p = (pointer)*plVar14;
    }
    curPixelInvocationNdx._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&curPixelInvocationNdx,
                                 (ulong)colorVecTypeName._M_dataplus._M_p);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      wrapX_1.field_2._M_allocated_capacity = *psVar17;
      wrapX_1.field_2._8_8_ = plVar14[3];
      wrapX_1._M_dataplus._M_p = (pointer)&wrapX_1.field_2;
    }
    else {
      wrapX_1.field_2._M_allocated_capacity = *psVar17;
      wrapX_1._M_dataplus._M_p = (pointer)*plVar14;
    }
    wrapX_1._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&wrapX_1);
    res.m_data._0_8_ = &local_758;
    puVar20 = (ulong *)(plVar14 + 2);
    if ((ulong *)*plVar14 == puVar20) {
      local_758 = *puVar20;
      _Stack_750._M_impl._0_8_ = plVar14[3];
    }
    else {
      local_758 = *puVar20;
      res.m_data._0_8_ = (ulong *)*plVar14;
    }
    unique0x00012000 = (TestLog *)plVar14[1];
    *plVar14 = (long)puVar20;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
  }
  else {
    res.m_data._0_8_ = &local_758;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,0x1af8059);
  }
  uVar23 = 0xf;
  if (local_970 != &local_960) {
    uVar23 = local_960;
  }
  if (uVar23 < (ulong)((long)stack0xfffffffffffff8a0 + local_968)) {
    uVar23 = 0xf;
    if ((ulong *)res.m_data._0_8_ != &local_758) {
      uVar23 = local_758;
    }
    if (uVar23 < (ulong)((long)stack0xfffffffffffff8a0 + local_968)) goto LAB_0147ecd7;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&res,0,(char *)0x0,(ulong)local_970);
  }
  else {
LAB_0147ecd7:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_970,res.m_data._0_8_);
  }
  local_850 = &local_840;
  plVar14 = puVar16 + 2;
  if ((long *)*puVar16 == plVar14) {
    local_840 = *plVar14;
    uStack_838 = puVar16[3];
  }
  else {
    local_840 = *plVar14;
    local_850 = (long *)*puVar16;
  }
  local_848 = puVar16[1];
  *puVar16 = plVar14;
  puVar16[1] = 0;
  *(undefined1 *)plVar14 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_850);
  plVar19 = plVar14 + 2;
  if ((long *)*plVar14 == plVar19) {
    local_378 = *plVar19;
    lStack_370 = plVar14[3];
    local_388 = &local_378;
  }
  else {
    local_378 = *plVar19;
    local_388 = (long *)*plVar14;
  }
  local_380 = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_128 = 5;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_388,local_380 + (long)local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_128 * 0x18),&local_120);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&imageData,(RenderContext *)this_00,(ProgramSources *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378 + 1);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850,local_840 + 1);
  }
  if ((ulong *)res.m_data._0_8_ != &local_758) {
    operator_delete((void *)res.m_data._0_8_,local_758 + 1);
  }
  if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wrapX_1._M_dataplus._M_p != &wrapX_1.field_2) {
      operator_delete(wrapX_1._M_dataplus._M_p,wrapX_1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)curPixelInvocationNdx._M_dataplus._M_p != &curPixelInvocationNdx.field_2) {
      operator_delete(curPixelInvocationNdx._M_dataplus._M_p,
                      curPixelInvocationNdx.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
      operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_970 != &local_960) {
    operator_delete(local_970,local_960 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,local_398 + 1);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8,local_a98 + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,local_3d8 + 1);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870,local_860 + 1);
  }
  if (local_950 != &local_940) {
    operator_delete(local_950,local_940 + 1);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if (local_990 != &local_980) {
    operator_delete(local_990,local_980 + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,local_418 + 1);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890,local_880 + 1);
  }
  if (local_9f0 != &local_9e0) {
    operator_delete(local_9f0,local_9e0 + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910,local_900 + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498 + 1);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0,local_8a0 + 1);
  }
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0,local_9c0 + 1);
  }
  if (AVar4 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_930 != &local_920) {
    operator_delete(local_930,local_920 + 1);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,local_4b8 + 1);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8,local_4d8 + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8 + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  pTVar6 = local_830;
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0,local_8c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38,(long)local_a28._vptr_RenderContext + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if (local_9b0 != local_9a0) {
    operator_delete(local_9b0,local_9a0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  res.m_data._0_8_ = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  _Stack_750._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_750._M_impl.super__Rb_tree_header._M_header;
  stack0xfffffffffffff8a0 = pTVar6;
  local_758 = CONCAT44(local_758._4_4_,local_180);
  _Stack_750._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_750._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_750._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_750._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_750._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(pTVar6,(ShaderProgram *)&imageData);
  if (local_158 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_180);
    glu::CallLogWrapper::glDispatchCompute(&glLog,local_bf8[0] * 5,local_bf8[1],local_c24);
    lVar12 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar8 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar8,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x99f);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&_Stack_750);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&imageData);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
    operator_delete(invocationCoord._M_dataplus._M_p,
                    invocationCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
    operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
    operator_delete(colorVecTypeName._M_dataplus._M_p,
                    colorVecTypeName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorScalarTypeName._M_dataplus._M_p != &colorScalarTypeName.field_2) {
    operator_delete(colorScalarTypeName._M_dataplus._M_p,
                    colorScalarTypeName.field_2._M_allocated_capacity + 1);
  }
  if (local_158 == false) goto LAB_0147f87d;
  AVar4 = this->m_caseType;
  dVar8 = returnValueTexture.super_ObjectWrapper.m_object;
  dVar9 = returnValueTextureBuf.super_ObjectWrapper.m_object;
  if (AVar4 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
LAB_0147f763:
    imageData.m_type = TEXTURETYPE_1D;
  }
  else {
    dVar8 = 0xffffffff;
    dVar9 = 0xffffffff;
    if (AVar4 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) goto LAB_0147f763;
    imageData.m_type = TEXTURETYPE_CUBE;
    dVar8 = endResultTexture.super_ObjectWrapper.m_object;
    dVar9 = endResultTextureBuf.super_ObjectWrapper.m_object;
  }
  imageData.m_size.m_data[0] = 1;
  imageData.m_size.m_data[1] = 1;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  stack0xfffffffffffff8a0 = (TestLog *)((ulong)stack0xfffffffffffff8a0 & 0xffffffff00000000);
  lVar12 = 0;
  do {
    res.m_data[lVar12] = imageData.m_size.m_data[lVar12 + -1] * local_bf8[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  if (AVar4 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
    verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
    TVar26 = this->m_imageType;
    ppuVar21 = &PTR_operator___02162f50;
LAB_0147f80a:
    verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)ppuVar21;
    *(TextureType *)&verifyLayer[1]._vptr_ImageLayerVerifier = TVar26;
    *(int *)((long)&verifyLayer[1]._vptr_ImageLayerVerifier + 4) = local_bf8[0];
  }
  else {
    if (AVar4 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      TVar26 = this->m_imageType;
      ppuVar21 = &PTR_operator___02162f90;
      goto LAB_0147f80a;
    }
    TVar26 = this->m_imageType;
    verifyLayer = (ImageLayerVerifier *)0x0;
  }
  bVar7 = readTextureAndVerify
                    ((RenderContext *)this_00,&glLog,dVar8,dVar9,TVar26,&this->m_format,&res,
                     verifyLayer);
  pcVar13 = "Image verification failed";
  if (bVar7) {
    pcVar13 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,pcVar13);
  (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
LAB_0147f87d:
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

AtomicCompSwapCase::IterateResult AtomicCompSwapCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	DE_ASSERT(isUintFormat || isIntFormat);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, IVec4(getCompareArg(IVec3(x, y, z), imageSize.x())));
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform atomics in compute shader.

	{
		// Generate compute shader.

		const string colorScalarTypeName	= isUintFormat ? "uint" : isIntFormat ? "int" : DE_NULL;
		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : DE_NULL) + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														"	" + colorScalarTypeName + " compare = " + colorScalarTypeName + getCompareArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " data    = " + colorScalarTypeName + getAssignArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " status  = " + colorScalarTypeName + "(-1);\n"
														"	status = imageAtomicCompSwap(u_results, " + atomicCoord + ", compare, data);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(status));\n" :
															"") +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Create reference, read texture and compare.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;

		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		// The relevant region of the texture being checked (potentially
		// different from actual texture size for cube maps, because cube maps
		// may have unused pixels due to square size restriction).
		const IVec3									relevantRegion		= imageSize * (m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT	? IVec3(1,							1,							1)
																					 :														  IVec3(NUM_INVOCATIONS_PER_PIXEL,	1,							1));

		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_imageType, imageSize.x())
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_imageType, imageSize.x())
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, relevantRegion, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}